

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SafetyCheckOk(sqlite3 *db)

{
  int iVar1;
  u8 eOpenState;
  sqlite3 *db_local;
  
  if (db == (sqlite3 *)0x0) {
    logBadConnection("NULL");
    db_local._4_4_ = 0;
  }
  else if (db->eOpenState == 'v') {
    db_local._4_4_ = 1;
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 != 0) {
      logBadConnection("unopened");
    }
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3SafetyCheckOk(sqlite3 *db){
  u8 eOpenState;
  if( db==0 ){
    logBadConnection("NULL");
    return 0;
  }
  eOpenState = db->eOpenState;
  if( eOpenState!=SQLITE_STATE_OPEN ){
    if( sqlite3SafetyCheckSickOrOk(db) ){
      testcase( sqlite3GlobalConfig.xLog!=0 );
      logBadConnection("unopened");
    }
    return 0;
  }else{
    return 1;
  }
}